

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *poVar2;
  uint uVar3;
  element_type *peVar4;
  undefined8 ss;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ss_00;
  pointer *__ptr;
  bool bVar8;
  char *__s;
  string error_message;
  ostringstream stream;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  undefined1 local_200 [32];
  string local_1e0;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&local_1e0,this);
  Message::Message((Message *)&local_208);
  ss_00._M_head_impl = local_208._M_head_impl;
  poVar1 = (ostream *)(local_208._M_head_impl + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  __s = this->statement_;
  if (__s == (char *)0x0) {
    sVar6 = 6;
    __s = "(null)";
  }
  else {
    sVar6 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      local_1a0[0]._M_string_length = 0;
      local_1a0[0]._M_dataplus._M_p = (pointer)&PTR__MatchResultListener_00395c40;
      peVar4 = (this->matcher_).
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      iVar5 = (*(peVar4->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                        (peVar4,&local_1e0);
      bVar8 = true;
      if ((char)iVar5 != '\0') goto LAB_002b0632;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      peVar4 = (this->matcher_).
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*(peVar4->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])
                (peVar4,local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected error.\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)local_200._0_8_,local_200._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_1c0,&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if (local_200._0_8_ != (long)local_200 + 0x10) {
        operator_delete((void *)local_200._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      local_208._M_head_impl = ss_00._M_head_impl;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
      uVar3 = this->status_;
      Message::Message((Message *)local_200);
      ss = local_200._0_8_;
      uVar7 = uVar3 & 0x7f;
      if (uVar7 == 0) {
        poVar2 = (ostream *)(local_200._0_8_ + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Exited with exit status ",0x18);
        std::ostream::operator<<((ostream *)poVar2,uVar3 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar7 * 0x1000000 + 0x1000000)) {
        poVar2 = (ostream *)(local_200._0_8_ + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Terminated by signal ",0x15);
        std::ostream::operator<<((ostream *)poVar2,uVar7);
      }
      if ((char)uVar3 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(ss + 0x10)," (core dumped)",0xe);
      }
      StringStreamToString(local_1a0,(stringstream *)ss);
      if ((stringstream *)ss != (stringstream *)0x0) {
        (**(code **)(*(long *)ss + 8))(ss);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput((string *)local_200,&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,(char *)local_200._0_8_,local_200._8_8_);
      if ((stringstream *)local_200._0_8_ != (stringstream *)(local_200 + 0x10)) {
        operator_delete((void *)local_200._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
        operator_delete(local_1a0[0]._M_dataplus._M_p);
      }
    }
    goto LAB_002b0630;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_1a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/src/gtest-death-test.cc"
                       ,0x265);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_1a0);
    local_208._M_head_impl = ss_00._M_head_impl;
    goto LAB_002b0630;
  }
  local_208._M_head_impl = ss_00._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
LAB_002b0630:
  bVar8 = false;
  ss_00._M_head_impl = local_208._M_head_impl;
LAB_002b0632:
  StringStreamToString(local_1a0,ss_00._M_head_impl);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p);
  }
  if (ss_00._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)ss_00._M_head_impl + 8))(ss_00._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return bVar8;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}